

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O2

N_Vector N_VClone_SensWrapper(N_Vector w)

{
  long lVar1;
  long *plVar2;
  N_Vector v;
  N_Vector p_Var3;
  long lVar4;
  
  v = N_VCloneEmpty_SensWrapper(w);
  if (v != (N_Vector)0x0) {
    plVar2 = (long *)v->content;
    *(undefined4 *)((long)plVar2 + 0xc) = 1;
    lVar4 = 0;
    do {
      if ((int)plVar2[1] <= lVar4) {
        return v;
      }
      p_Var3 = N_VClone(*(N_Vector *)(*w->content + lVar4 * 8));
      *(N_Vector *)(*plVar2 + lVar4 * 8) = p_Var3;
      lVar1 = lVar4 * 8;
      lVar4 = lVar4 + 1;
    } while (*(long *)(*plVar2 + lVar1) != 0);
    N_VDestroy(v);
  }
  return (N_Vector)0x0;
}

Assistant:

N_Vector N_VClone_SensWrapper(N_Vector w)
{
  N_Vector v;
  int i;

  /* create empty wrapper */
  v = NULL;
  v = N_VCloneEmpty_SensWrapper(w);
  if (v == NULL) { return (NULL); }

  /* update own vectors status */
  NV_OWN_VECS_SW(v) = SUNTRUE;

  /* allocate arrays */
  for (i = 0; i < NV_NVECS_SW(v); i++)
  {
    NV_VEC_SW(v, i) = N_VClone(NV_VEC_SW(w, i));
    if (NV_VEC_SW(v, i) == NULL)
    {
      N_VDestroy(v);
      return (NULL);
    }
  }

  return (v);
}